

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  uint uVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  int iVar5;
  xmlParserErrors code;
  xmlCharEncError xVar6;
  ulong uVar7;
  ulong uVar8;
  void *implCtxt;
  ulong uVar9;
  uint uVar10;
  xmlCharEncConvImpl impl;
  xmlCharEncoding enc;
  char *name;
  long lVar11;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  uint local_fc;
  xmlCharEncodingHandler *local_f8;
  undefined4 local_ec;
  byte local_e8 [200];
  
  iVar5 = xmlParserGrow(ctxt);
  if (-1 < iVar5) {
    pxVar3 = ctxt->input;
    pbVar4 = pxVar3->cur;
    if (3 < (long)pxVar3->end - (long)pbVar4) {
      uVar2 = pxVar3->flags;
      bVar1 = *pbVar4;
      if ((uVar2 & 1) == 0) {
        if (bVar1 < 0xef) {
          if (bVar1 == 0) {
            if ((ctxt->html != 0) || (pbVar4[1] != 0)) {
              if (pbVar4[1] != 0x3c) {
                return;
              }
              if (pbVar4[2] != 0) {
                return;
              }
              if (pbVar4[3] != 0x3f) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16BE;
              uVar10 = 6;
              goto LAB_00142d35;
            }
            if (pbVar4[2] != 0) {
              return;
            }
            if (pbVar4[3] != 0x3c) {
              return;
            }
            enc = XML_CHAR_ENCODING_UCS4BE;
          }
          else {
            if (bVar1 != 0x3c) {
              if (bVar1 != 0x4c) {
                return;
              }
              if (ctxt->html != 0) {
                return;
              }
              if (pbVar4[1] != 0x6f) {
                return;
              }
              if (pbVar4[2] != 0xa7) {
                return;
              }
              if (pbVar4[3] != 0x94) {
                return;
              }
              pxVar3->flags = uVar2 | 8;
              code = xmlCreateCharEncodingHandler
                               ("IBM037",XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&local_f8);
              if (code == XML_ERR_OK) {
                local_fc = 199;
                local_ec = *(int *)&pxVar3->end - (int)pxVar3->cur;
                xVar6 = xmlEncInputChunk(local_f8,local_e8,(int *)&local_fc,pxVar3->cur,&local_ec,0)
                ;
                if (XML_ENC_ERR_INTERNAL < xVar6) {
                  uVar7 = (ulong)(int)local_fc;
                  local_e8[uVar7] = 0;
                  if (0 < (long)uVar7) {
                    lVar11 = 0;
                    do {
                      if (local_e8[lVar11] == 0x65) {
                        iVar5 = xmlStrncmp(local_e8 + lVar11,"encoding",8);
                        if (iVar5 == 0) {
                          uVar7 = lVar11 + 10;
                          goto LAB_00142db9;
                        }
                        uVar7 = (ulong)local_fc;
                      }
                      else if (local_e8[lVar11] == 0x3e) break;
                      lVar11 = lVar11 + 1;
                    } while (lVar11 < (int)uVar7);
                  }
                }
LAB_00142be0:
                xmlCharEncCloseFunc(local_f8);
                impl = ctxt->convImpl;
                implCtxt = ctxt->convCtxt;
                name = "IBM037";
LAB_00142c02:
                code = xmlCreateCharEncodingHandler(name,XML_ENC_INPUT,impl,implCtxt,&local_f8);
                if (code == XML_ERR_OK) {
                  xmlSwitchToEncoding(ctxt,local_f8);
                  return;
                }
              }
              xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
              return;
            }
            if (pbVar4[1] != 0) {
              return;
            }
            if ((ctxt->html != 0) || (pbVar4[2] != 0)) {
              if (pbVar4[2] != 0x3f) {
                return;
              }
              if (pbVar4[3] != 0) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16LE;
              uVar10 = 4;
              goto LAB_00142d35;
            }
            if (pbVar4[3] != 0) {
              return;
            }
            enc = XML_CHAR_ENCODING_UCS4LE;
          }
          uVar10 = 8;
        }
        else {
          if (bVar1 == 0xef) {
            if (pbVar4[1] != 0xbb) {
              return;
            }
            if (pbVar4[2] != 0xbf) {
              return;
            }
            enc = XML_CHAR_ENCODING_UTF8;
            uVar10 = 2;
            lVar11 = 3;
          }
          else {
            if (bVar1 == 0xfe) {
              if (pbVar4[1] != 0xff) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16BE;
              uVar10 = 6;
            }
            else {
              if (bVar1 != 0xff) {
                return;
              }
              if (pbVar4[1] != 0xfe) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16LE;
              uVar10 = 4;
            }
            lVar11 = 2;
          }
          pxVar3->cur = pbVar4 + lVar11;
        }
LAB_00142d35:
        pxVar3->flags = uVar10 | uVar2;
        xmlSwitchEncoding(ctxt,enc);
        return;
      }
      if (((bVar1 == 0xef) && (pbVar4[1] == 0xbb)) && (pbVar4[2] == 0xbf)) {
        pxVar3->cur = pbVar4 + 3;
      }
    }
  }
  return;
LAB_00142db9:
  uVar8 = (ulong)local_e8[uVar7 - 2];
  if (0x3d < uVar8) goto LAB_00142be0;
  if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
    if (uVar8 == 0x3d) goto LAB_00142dde;
    goto LAB_00142be0;
  }
  uVar7 = uVar7 + 1;
  goto LAB_00142db9;
LAB_00142dde:
  uVar8 = (ulong)local_e8[uVar7 - 1];
  if (uVar8 < 0x28) {
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) goto code_r0x00142df4;
    if ((0x8400000000U >> (uVar8 & 0x3f) & 1) != 0) {
      uVar9 = (ulong)(int)uVar7;
      uVar8 = uVar7 & 0xffffffff;
      while (((bVar1 = local_e8[uVar8], (byte)(bVar1 - 0x30) < 10 ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
             ((bVar1 - 0x2d < 0x33 &&
              ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0))))) {
        uVar9 = uVar9 + 1;
        uVar8 = uVar9;
      }
      if (bVar1 != local_e8[uVar7 - 1]) goto LAB_00142be0;
      local_e8[uVar9 & 0xffffffff] = 0;
      xmlCharEncCloseFunc(local_f8);
      name = (char *)(local_e8 + (uVar7 & 0xffffffff));
      impl = ctxt->convImpl;
      implCtxt = ctxt->convCtxt;
      goto LAB_00142c02;
    }
  }
  goto LAB_00142be0;
code_r0x00142df4:
  uVar7 = uVar7 + 1;
  goto LAB_00142dde;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            xmlParserErrors res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}